

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isalpha.c
# Opt level: O1

int main(void)

{
  if ((_PDCLIB_lc_ctype->entry[0x61].flags & 1) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1a,"isalpha( \'a\' )");
  }
  if ((_PDCLIB_lc_ctype->entry[0x7a].flags & 1) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1b,"isalpha( \'z\' )");
  }
  if ((_PDCLIB_lc_ctype->entry[0x20].flags & 1) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1c,"! isalpha( \' \' )");
  }
  if ((_PDCLIB_lc_ctype->entry[0x31].flags & 1) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1d,"! isalpha( \'1\' )");
  }
  if ((_PDCLIB_lc_ctype->entry[0x40].flags & 1) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1e,"! isalpha( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isalpha( 'a' ) );
    TESTCASE( isalpha( 'z' ) );
    TESTCASE( ! isalpha( ' ' ) );
    TESTCASE( ! isalpha( '1' ) );
    TESTCASE( ! isalpha( '@' ) );
    return TEST_RESULTS;
}